

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.cxx
# Opt level: O1

void xray_re::initialize(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  
  uVar5 = 0x1fff;
  do {
    uVar1 = (uint)(uVar5 >> 7) & 0x1ffffff;
    uVar4 = (uint)uVar5 & 0x7f;
    uVar2 = uVar4 ^ 0x7f;
    uVar3 = 0x7f - uVar1;
    if (uVar1 + uVar4 < 0x7f) {
      uVar2 = uVar4;
      uVar3 = uVar1;
    }
    fVar7 = (126.0 - (float)(int)uVar3) - (float)uVar2;
    fVar7 = fVar7 * fVar7 + (float)(int)(uVar2 * uVar2 + uVar3 * uVar3);
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
    *(float *)(uv_adjustment + uVar5 * 4) = 1.0 / fVar7;
    uVar6 = uVar5 + 1;
    uVar5 = uVar5 - 1;
  } while (1 < uVar6);
  initialized = 1;
  return;
}

Assistant:

void initialize()
{
//	for (int i = 0; i != xr_dim(uv_adjustment); ++i) {
	for (int i = xr_dim(uv_adjustment); --i >= 0;) {
		int u = i >> 7;
		int v = i & 0x7f;
		if (u + v >= 127) {
			u = 127 - u;
			v = 127 - v;
		}
		uv_adjustment[i] = 1.f/std::sqrt(u*u + v*v + (126.f-u-v)*(126.f-u-v));
	}
	initialized = true;
}